

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageFieldGenerator::GenerateBuildingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  PrintNestedBuilderCondition
            (this,printer,"result.$name$_ = $name$_;\n","result.$name$_ = $name$Builder_.build();\n"
            );
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {

  printer->Print(variables_,
      "if ($get_has_field_bit_from_local$) {\n"
      "  $set_has_field_bit_to_local$;\n"
      "}\n");

  PrintNestedBuilderCondition(printer,
    "result.$name$_ = $name$_;\n",

    "result.$name$_ = $name$Builder_.build();\n");
}